

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Cluster * mkvparser::Cluster::Create(Segment *pSegment,long idx,longlong off)

{
  long lVar1;
  Cluster *this;
  
  if (-1 < off && pSegment != (Segment *)0x0) {
    lVar1 = pSegment->m_start;
    this = (Cluster *)operator_new(0x48,(nothrow_t *)&std::nothrow);
    if (this != (Cluster *)0x0) {
      Cluster(this,pSegment,idx,lVar1 + off);
      return this;
    }
  }
  return (Cluster *)0x0;
}

Assistant:

Cluster* Cluster::Create(Segment* pSegment, long idx, long long off) {
  if (!pSegment || off < 0)
    return NULL;

  const long long element_start = pSegment->m_start + off;

  Cluster* const pCluster =
      new (std::nothrow) Cluster(pSegment, idx, element_start);

  return pCluster;
}